

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

int __thiscall Qclass::Train(Qclass *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int local_58;
  int local_54;
  int j;
  int i;
  int start_y_1;
  int start_x_1;
  int lastAction;
  int lastState;
  int k;
  int state;
  int prev_y;
  int prev_x;
  int goal_state;
  int start_y;
  int start_x;
  int new_state;
  int new_y;
  int action;
  int new_x;
  int initialTrial;
  Qclass *this_local;
  
  createGrid(this);
  bVar1 = true;
  new_y = 0;
  start_x = 0;
  iVar2 = rand();
  goal_state = iVar2 % 0x32;
  iVar2 = rand();
  prev_x = iVar2 % 0x32;
  iVar2 = findState(this,this->goal_x,this->goal_y);
  if (this->grid[goal_state][prev_x] == 1) {
    while (this->grid[goal_state][prev_x] == 1) {
      iVar3 = rand();
      goal_state = iVar3 % 0x32;
      iVar3 = rand();
      prev_x = iVar3 % 0x32;
    }
  }
  state = goal_state;
  k = prev_x;
  lastState = findState(this,goal_state,prev_x);
  for (lastAction = 0; lastAction < 50000; lastAction = lastAction + 1) {
    start_x_1 = 0;
    start_y_1 = 0;
    while (start_x_1 != iVar2) {
      if (!bVar1) {
        if (start_y_1 == 0) {
          new_y = state + 1;
          start_x = k;
        }
        if (start_y_1 == 1) {
          new_y = state + -1;
          start_x = k;
        }
        if (start_y_1 == 2) {
          new_y = state;
          start_x = k + 1;
        }
        if (start_y_1 == 3) {
          new_y = state;
          start_x = k + -1;
        }
        iVar3 = findState(this,new_y,start_x);
        Qupdate(this,start_y_1,start_x_1,state,k,iVar3);
        state = new_y;
        k = start_x;
        lastState = findState(this,new_y,start_x);
      }
      start_y_1 = detAction(this,lastState);
      bVar1 = false;
      start_x_1 = lastState;
      if ((this->restart & 1U) == 1) {
        this->restart = false;
        bVar1 = true;
        iVar3 = rand();
        i = iVar3 % 0x32;
        iVar3 = rand();
        j = iVar3 % 0x32;
        if (this->grid[i][j] == 1) {
          while (this->grid[i][j] == 1) {
            iVar3 = rand();
            i = iVar3 % 0x32;
            iVar3 = rand();
            j = iVar3 % 0x32;
          }
        }
        state = i;
        k = j;
        start_x_1 = findState(this,i,j);
        start_y_1 = detAction(this,start_x_1);
        lastState = start_x_1;
      }
    }
  }
  for (local_54 = 0; local_54 < 0x9c4; local_54 = local_54 + 1) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_54);
    std::operator<<(poVar4,"  ");
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,this->Q[local_54][local_58]);
      std::operator<<(poVar4,"  ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int Qclass::Train() {
  Qclass::createGrid();
  int initialTrial = 1;
  int new_x = 0;
  int action = 0;
  int new_y = 0;
  int new_state = 0;
  int start_x = rand() % 50;
  int start_y = rand() % 50;
  int goal_state = findState(goal_x, goal_y);
  if (grid[start_x][start_y] == 1) {
    while (grid[start_x][start_y] == 1) {
      start_x = rand() % 50;
      start_y = rand() % 50;
    }
  }
  int prev_x = start_x;
  int prev_y = start_y;
  int state = findState(start_x, start_y);
  for (int k = 0; k < 50000; k++) {
    int lastState = 0;
    int lastAction = 0;
    while (lastState != goal_state) {
      // Skips this loop for first run as there are no previous nodes
      if (initialTrial == 0) {
        if (lastAction == 0) {
          new_x = prev_x + 1;
          new_y = prev_y;
        }
        if (lastAction == 1) {
          new_x = prev_x - 1;
          new_y = prev_y;
        }
        if (lastAction == 2) {
          new_x = prev_x;
          new_y = prev_y + 1;
        }
        if (lastAction == 3) {
          new_x = prev_x;
          new_y = prev_y - 1;
        }
        new_state = findState(new_x, new_y);
        Qupdate(lastAction, lastState, prev_x, prev_y, new_state);
        prev_x = new_x;
        prev_y = new_y;
        state = findState(prev_x, prev_y);
      }
      action = detAction(state);
      lastState = state;
      lastAction = action;
      initialTrial = 0;
      // Reinitialize all the training data whenever a collision occurs
      if (restart == true) {
        restart = false;
        initialTrial = 1;
        int start_x = rand() % 50;
        int start_y = rand() % 50;
        if (grid[start_x][start_y] == 1) {
          while (grid[start_x][start_y] == 1) {
            start_x = rand() % 50;
            start_y = rand() % 50;
          }
        }
        prev_x = start_x;
        prev_y = start_y;
        state = findState(start_x, start_y);
        action = detAction(state);
        lastState = state;
        lastAction = action;
      }
    }
  }
  // Outputting the Q table for 2500 states and 4 actions
  for (int i = 0; i < 2500; i++) {
    std::cout << i << "  ";
    for (int j = 0; j < 4; j++) {
      std::cout << Q[i][j] << "  ";
    }
    std::cout << std::endl;
  }
  return 0;
}